

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O1

void __thiscall
Assimp::ASEImporter::ConvertMeshes
          (ASEImporter *this,Mesh *mesh,vector<aiMesh_*,_std::allocator<aiMesh_*>_> *avOutMeshes)

{
  vector<aiVertexWeight,std::allocator<aiVertexWeight>> *this_00;
  uint uVar1;
  Parser *pPVar2;
  iterator iVar3;
  pointer pBVar4;
  pointer pBVar5;
  pointer paVar6;
  pointer paVar7;
  pointer paVar8;
  pointer paVar9;
  iterator __position;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  aiVertexWeight aVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  pointer pMVar19;
  uint uVar20;
  ulong uVar21;
  Logger *pLVar22;
  ulong uVar23;
  ulong uVar24;
  ulong *puVar25;
  aiMesh *paVar26;
  ulong *puVar27;
  aiFace *paVar28;
  aiVector3D *paVar29;
  _func_int **pp_Var30;
  uint *puVar31;
  aiColor4D *paVar32;
  aiBone **ppaVar33;
  aiBone *paVar34;
  aiVertexWeight *paVar35;
  void *pvVar36;
  pointer pFVar37;
  aiFace *paVar38;
  int iVar39;
  iterator __position_00;
  long lVar40;
  pointer pMVar41;
  uint uVar42;
  uint c;
  pointer *ppaVar43;
  pointer ppVar44;
  long lVar45;
  pointer pBVar46;
  aiMesh *p_pcOut;
  aiVertexWeight weight;
  vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> vSubMaterials;
  undefined8 local_a8;
  aiMesh *local_a0;
  pointer local_98;
  pair<unsigned_int,_float> local_90;
  aiBone **local_88;
  vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> local_80;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_68;
  ulong local_60;
  ulong *local_58;
  vector<aiMesh*,std::allocator<aiMesh*>> *local_50;
  ASEImporter *local_48;
  ulong *local_40;
  ulong local_38;
  
  uVar21 = ((long)(this->mParser->m_vMaterials).
                  super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->mParser->m_vMaterials).
                  super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 5) * -0x2c8590b21642c859;
  local_50 = (vector<aiMesh*,std::allocator<aiMesh*>> *)avOutMeshes;
  local_48 = this;
  if (uVar21 < mesh->iMaterialIndex || uVar21 - mesh->iMaterialIndex == 0) {
    mesh->iMaterialIndex = (int)uVar21 - 1;
    pLVar22 = DefaultLogger::get();
    Logger::warn(pLVar22,"Material index is out of range");
  }
  pPVar2 = local_48->mParser;
  uVar20 = mesh->iMaterialIndex;
  pMVar41 = (pPVar2->m_vMaterials).
            super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       &pMVar41[uVar20].avSubMaterials.
        super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl ==
      *(pointer *)
       ((long)&pMVar41[uVar20].avSubMaterials.
               super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
               _M_impl + 8)) {
    paVar26 = (aiMesh *)operator_new(0x520);
    paVar26->mPrimitiveTypes = 0;
    paVar26->mNumVertices = 0;
    paVar26->mNumFaces = 0;
    memset(&paVar26->mVertices,0,0xcc);
    paVar26->mBones = (aiBone **)0x0;
    paVar26->mMaterialIndex = 0;
    (paVar26->mName).length = 0;
    (paVar26->mName).data[0] = '\0';
    memset((paVar26->mName).data + 1,0x1b,0x3ff);
    paVar26->mNumAnimMeshes = 0;
    paVar26->mAnimMeshes = (aiAnimMesh **)0x0;
    paVar26->mMethod = 0;
    (paVar26->mAABB).mMin.x = 0.0;
    (paVar26->mAABB).mMin.y = 0.0;
    (paVar26->mAABB).mMin.z = 0.0;
    (paVar26->mAABB).mMax.x = 0.0;
    (paVar26->mAABB).mMax.y = 0.0;
    (paVar26->mAABB).mMax.z = 0.0;
    paVar26->mTextureCoords[0] = (aiVector3D *)0x0;
    paVar26->mTextureCoords[1] = (aiVector3D *)0x0;
    paVar26->mTextureCoords[2] = (aiVector3D *)0x0;
    paVar26->mTextureCoords[3] = (aiVector3D *)0x0;
    paVar26->mTextureCoords[4] = (aiVector3D *)0x0;
    paVar26->mTextureCoords[5] = (aiVector3D *)0x0;
    paVar26->mTextureCoords[6] = (aiVector3D *)0x0;
    paVar26->mTextureCoords[7] = (aiVector3D *)0x0;
    paVar26->mNumUVComponents[0] = 0;
    paVar26->mNumUVComponents[1] = 0;
    paVar26->mNumUVComponents[2] = 0;
    paVar26->mNumUVComponents[3] = 0;
    paVar26->mNumUVComponents[4] = 0;
    paVar26->mNumUVComponents[5] = 0;
    paVar26->mNumUVComponents[6] = 0;
    paVar26->mNumUVComponents[7] = 0;
    paVar26->mColors[0] = (aiColor4D *)0x0;
    paVar26->mColors[1] = (aiColor4D *)0x0;
    paVar26->mColors[2] = (aiColor4D *)0x0;
    paVar26->mColors[3] = (aiColor4D *)0x0;
    paVar26->mColors[4] = (aiColor4D *)0x0;
    paVar26->mColors[5] = (aiColor4D *)0x0;
    paVar26->mColors[6] = (aiColor4D *)0x0;
    paVar26->mColors[7] = (aiColor4D *)0x0;
    paVar26->mPrimitiveTypes = 4;
    paVar26->mMaterialIndex = 0xffffffff;
    (pPVar2->m_vMaterials).
    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
    super__Vector_impl_data._M_start[uVar20].bNeed = true;
    paVar26->mColors[3] = (aiColor4D *)(ulong)mesh->iMaterialIndex;
    paVar26->mColors[2] = (aiColor4D *)mesh;
    iVar3._M_current = *(aiMesh ***)(local_50 + 8);
    local_a8 = paVar26;
    if (iVar3._M_current == *(aiMesh ***)(local_50 + 0x10)) {
      std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                (local_50,iVar3,(aiMesh **)&local_a8);
    }
    else {
      *iVar3._M_current = paVar26;
      *(long *)(local_50 + 8) = *(long *)(local_50 + 8) + 8;
    }
    paVar26 = local_a8;
    if ((mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
        super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
        super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      paVar6 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      paVar7 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (paVar6 != paVar7) {
        local_a8->mNumVertices = (int)((ulong)((long)paVar7 - (long)paVar6) >> 2) * -0x55555555;
        uVar20 = (int)((long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                             super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                             super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x3e0f83e1;
        local_a8->mNumFaces = uVar20;
        uVar21 = (ulong)uVar20;
        puVar27 = (ulong *)operator_new__(uVar21 * 0x10 + 8);
        *puVar27 = uVar21;
        paVar28 = (aiFace *)(puVar27 + 1);
        if (uVar21 != 0) {
          paVar38 = paVar28;
          do {
            paVar38->mNumIndices = 0;
            paVar38->mIndices = (uint *)0x0;
            paVar38 = paVar38 + 1;
          } while (paVar38 != paVar28 + uVar21);
        }
        local_a0 = paVar26;
        paVar26->mFaces = paVar28;
        paVar6 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        paVar7 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = ((long)paVar7 - (long)paVar6 >> 2) * -0x5555555555555555;
        uVar21 = SUB168(auVar12 * ZEXT816(0xc),0);
        if (SUB168(auVar12 * ZEXT816(0xc),8) != 0) {
          uVar21 = 0xffffffffffffffff;
        }
        paVar29 = (aiVector3D *)operator_new__(uVar21);
        lVar45 = (long)paVar7 - (long)paVar6;
        if (lVar45 != 0) {
          memset(paVar29,0,((lVar45 - 0xcU) / 0xc) * 0xc + 0xc);
        }
        paVar26 = local_a0;
        local_a0->mVertices = paVar29;
        paVar6 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        memcpy(paVar29,paVar6,
               (long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)paVar6);
        paVar6 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        paVar7 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = ((long)paVar7 - (long)paVar6 >> 2) * -0x5555555555555555;
        uVar21 = 0xffffffffffffffff;
        if (SUB168(auVar13 * ZEXT816(0xc),8) == 0) {
          uVar21 = SUB168(auVar13 * ZEXT816(0xc),0);
        }
        paVar29 = (aiVector3D *)operator_new__(uVar21);
        lVar45 = (long)paVar7 - (long)paVar6;
        if (lVar45 != 0) {
          memset(paVar29,0,((lVar45 - 0xcU) / 0xc) * 0xc + 0xc);
        }
        paVar26->mNormals = paVar29;
        paVar6 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        memcpy(paVar29,paVar6,
               (long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)paVar6);
        ppaVar43 = &mesh->amTexCoords[0].
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        lVar45 = 0;
        do {
          if (((_Vector_impl_data *)(ppaVar43 + -1))->_M_start != *ppaVar43) {
            lVar40 = (long)*ppaVar43 - (long)((_Vector_impl_data *)(ppaVar43 + -1))->_M_start;
            auVar14._8_8_ = 0;
            auVar14._0_8_ = (lVar40 >> 2) * -0x5555555555555555;
            uVar21 = SUB168(auVar14 * ZEXT816(0xc),0);
            if (SUB168(auVar14 * ZEXT816(0xc),8) != 0) {
              uVar21 = 0xffffffffffffffff;
            }
            pvVar36 = operator_new__(uVar21);
            memset(pvVar36,0,((lVar40 - 0xcU) / 0xc) * 0xc + 0xc);
            *(void **)((long)local_a8->mTextureCoords + lVar45 * 2) = pvVar36;
            memcpy(*(void **)((long)local_a8->mTextureCoords + lVar45 * 2),
                   ((_Vector_impl_data *)(ppaVar43 + -1))->_M_start,
                   (long)*ppaVar43 - (long)((_Vector_impl_data *)(ppaVar43 + -1))->_M_start);
            *(undefined4 *)((long)local_a8->mNumUVComponents + lVar45) =
                 *(undefined4 *)((long)mesh->mNumUVComponents + lVar45);
          }
          ppaVar43 = ppaVar43 + 3;
          lVar45 = lVar45 + 4;
        } while (lVar45 != 0x20);
        paVar8 = (mesh->mVertexColors).
                 super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        paVar9 = (mesh->mVertexColors).
                 super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (paVar8 != paVar9) {
          uVar23 = (long)paVar9 - (long)paVar8;
          uVar21 = 0xffffffffffffffff;
          if (-1 < (long)uVar23) {
            uVar21 = uVar23;
          }
          paVar32 = (aiColor4D *)operator_new__(uVar21);
          memset(paVar32,0,(uVar23 - 0x10 & 0xfffffffffffffff0) + 0x10);
          local_a8->mColors[0] = paVar32;
          paVar8 = (mesh->mVertexColors).
                   super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                   super__Vector_impl_data._M_start;
          memcpy(paVar32,paVar8,
                 (long)(mesh->mVertexColors).
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar8);
        }
        if (local_a8->mNumFaces != 0) {
          lVar45 = 0;
          lVar40 = 0;
          uVar21 = 0;
          do {
            *(undefined4 *)((long)&local_a8->mFaces->mNumIndices + lVar40) = 3;
            pvVar36 = operator_new__(0xc);
            *(void **)((long)&local_a8->mFaces->mIndices + lVar40) = pvVar36;
            **(undefined4 **)((long)&local_a8->mFaces->mIndices + lVar40) =
                 *(undefined4 *)
                  ((long)(((mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                           super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_FaceWithSmoothingGroup)
                         .mIndices + lVar45);
            *(undefined4 *)(*(long *)((long)&local_a8->mFaces->mIndices + lVar40) + 4) =
                 *(undefined4 *)
                  ((long)(((mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                           super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_FaceWithSmoothingGroup)
                         .mIndices + lVar45 + 4);
            *(undefined4 *)(*(long *)((long)&local_a8->mFaces->mIndices + lVar40) + 8) =
                 *(undefined4 *)
                  ((long)(((mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                           super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_FaceWithSmoothingGroup)
                         .mIndices + lVar45 + 8);
            uVar21 = uVar21 + 1;
            lVar40 = lVar40 + 0x10;
            lVar45 = lVar45 + 0x84;
          } while (uVar21 < local_a8->mNumFaces);
        }
        pBVar4 = (mesh->mBones).
                 super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pBVar5 = (mesh->mBones).
                 super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((pBVar4 != pBVar5) &&
           ((mesh->mBoneVertices).
            super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (mesh->mBoneVertices).
            super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>.
            _M_impl.super__Vector_impl_data._M_finish)) {
          std::
          vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
          ::vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                    *)&local_80,(long)pBVar5 - (long)pBVar4 >> 5,(allocator_type *)&local_90);
          pBVar46 = (mesh->mBoneVertices).
                    super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (pBVar46 !=
              (mesh->mBoneVertices).
              super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            uVar20 = 0;
            do {
              for (ppVar44 = (pBVar46->mBoneWeights).
                             super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  ppVar44 !=
                  (pBVar46->mBoneWeights).
                  super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; ppVar44 = ppVar44 + 1) {
                local_90.second = ppVar44->second;
                this_00 = (vector<aiVertexWeight,std::allocator<aiVertexWeight>> *)
                          (&((local_80.
                              super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                              ._M_impl.super__Vector_impl_data._M_start)->super_Material).
                            _vptr_Material + (long)ppVar44->first * 3);
                __position._M_current = *(aiVertexWeight **)(this_00 + 8);
                local_90.first = uVar20;
                if (__position._M_current == *(aiVertexWeight **)(this_00 + 0x10)) {
                  std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>::
                  _M_realloc_insert<aiVertexWeight_const&>
                            (this_00,__position,(aiVertexWeight *)&local_90);
                }
                else {
                  aVar15.mWeight = local_90.second;
                  aVar15.mVertexId = uVar20;
                  *__position._M_current = aVar15;
                  *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
                }
              }
              pBVar46 = pBVar46 + 1;
              uVar20 = uVar20 + 1;
            } while (pBVar46 !=
                     (mesh->mBoneVertices).
                     super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          paVar26 = local_a8;
          local_a8->mNumBones = 0;
          if ((mesh->mBones).
              super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (mesh->mBones).
              super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar20 = 1;
            uVar21 = 0;
            do {
              if ((&((local_80.
                      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                      ._M_impl.super__Vector_impl_data._M_start)->super_Material)._vptr_Material)
                  [uVar21 * 3] !=
                  (_func_int **)
                  (&((local_80.
                      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                      ._M_impl.super__Vector_impl_data._M_start)->super_Material).mName._M_dataplus)
                  [uVar21 * 3]._M_p) {
                local_a8->mNumBones = local_a8->mNumBones + 1;
              }
              uVar21 = (ulong)uVar20;
              uVar20 = uVar20 + 1;
            } while (uVar21 < (ulong)((long)(mesh->mBones).
                                            super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(mesh->mBones).
                                            super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          ppaVar33 = (aiBone **)operator_new__((ulong)local_a8->mNumBones << 3);
          paVar26->mBones = ppaVar33;
          if ((mesh->mBones).
              super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (mesh->mBones).
              super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar20 = 1;
            uVar21 = 0;
            do {
              local_a0 = (aiMesh *)(uVar21 * 3);
              if ((&((local_80.
                      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                      ._M_impl.super__Vector_impl_data._M_start)->super_Material)._vptr_Material)
                  [uVar21 * 3] !=
                  (_func_int **)
                  (&((local_80.
                      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                      ._M_impl.super__Vector_impl_data._M_start)->super_Material).mName._M_dataplus)
                  [uVar21 * 3]._M_p) {
                local_68 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                           CONCAT44(local_68._4_4_,uVar20);
                local_88 = ppaVar33;
                paVar34 = (aiBone *)operator_new(0x460);
                (paVar34->mName).length = 0;
                (paVar34->mName).data[0] = '\0';
                memset((paVar34->mName).data + 1,0x1b,0x3ff);
                paVar34->mNumWeights = 0;
                paVar34->mWeights = (aiVertexWeight *)0x0;
                (paVar34->mOffsetMatrix).a1 = 1.0;
                (paVar34->mOffsetMatrix).a2 = 0.0;
                (paVar34->mOffsetMatrix).a3 = 0.0;
                (paVar34->mOffsetMatrix).a4 = 0.0;
                (paVar34->mOffsetMatrix).b1 = 0.0;
                (paVar34->mOffsetMatrix).b2 = 1.0;
                (paVar34->mOffsetMatrix).b3 = 0.0;
                (paVar34->mOffsetMatrix).b4 = 0.0;
                (paVar34->mOffsetMatrix).c1 = 0.0;
                (paVar34->mOffsetMatrix).c2 = 0.0;
                (paVar34->mOffsetMatrix).c3 = 1.0;
                (paVar34->mOffsetMatrix).c4 = 0.0;
                (paVar34->mOffsetMatrix).d1 = 0.0;
                (paVar34->mOffsetMatrix).d2 = 0.0;
                (paVar34->mOffsetMatrix).d3 = 0.0;
                (paVar34->mOffsetMatrix).d4 = 1.0;
                *local_88 = paVar34;
                pBVar4 = (mesh->mBones).
                         super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                uVar23 = pBVar4[uVar21].mName._M_string_length;
                if (uVar23 < 0x400) {
                  (paVar34->mName).length = (ai_uint32)uVar23;
                  memcpy((paVar34->mName).data,pBVar4[uVar21].mName._M_dataplus._M_p,uVar23);
                  (paVar34->mName).data[uVar23] = '\0';
                }
                local_98 = local_80.
                           super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                uVar24 = (long)(&((local_80.
                                   super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->super_Material).mName
                                 ._M_dataplus)[(long)local_a0]._M_p -
                         (long)(&((local_80.
                                   super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->super_Material).
                                 _vptr_Material)[(long)local_a0];
                uVar23 = (long)uVar24 >> 3;
                paVar34->mNumWeights = (uint)uVar23;
                uVar23 = uVar23 & 0xffffffff;
                uVar21 = uVar23 * 8;
                paVar35 = (aiVertexWeight *)operator_new__(uVar21);
                if (uVar23 != 0) {
                  memset(paVar35,0,uVar21);
                }
                paVar34->mWeights = paVar35;
                memcpy(paVar35,(&(local_98->super_Material)._vptr_Material)[(long)local_a0],
                       uVar24 & 0x7fffffff8);
                ppaVar33 = local_88 + 1;
                uVar20 = (uint)local_68;
              }
              uVar21 = (ulong)uVar20;
              uVar20 = uVar20 + 1;
            } while (uVar21 < (ulong)((long)(mesh->mBones).
                                            super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(mesh->mBones).
                                            super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          std::
          vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
          ::~vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                     *)&local_80);
        }
      }
    }
  }
  else {
    std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::vector
              (&local_80,&pMVar41[uVar20].avSubMaterials);
    pMVar19 = local_80.
              super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pMVar41 = local_80.
              super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar21 = ((long)local_80.
                    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_80.
                   super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x2e0;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar21;
    uVar23 = SUB168(auVar10 * ZEXT816(0x18),0);
    uVar24 = uVar23 + 8;
    if (0xfffffffffffffff7 < uVar23) {
      uVar24 = 0xffffffffffffffff;
    }
    uVar23 = 0xffffffffffffffff;
    if (SUB168(auVar10 * ZEXT816(0x18),8) == 0) {
      uVar23 = uVar24;
    }
    puVar25 = (ulong *)operator_new__(uVar23);
    *puVar25 = uVar21;
    puVar27 = puVar25 + 1;
    if (pMVar19 != pMVar41) {
      memset(puVar27,0,((uVar21 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
    }
    local_a8 = (aiMesh *)((ulong)local_a8._4_4_ << 0x20);
    pFVar37 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
              super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_40 = puVar25;
    if ((mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
        super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
        super__Vector_impl_data._M_finish != pFVar37) {
      uVar21 = 0;
      do {
        uVar23 = (ulong)pFVar37[uVar21].iMaterial;
        uVar24 = ((long)local_80.
                        super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_80.
                        super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x2c8590b21642c859;
        if (uVar24 < uVar23 || uVar24 - uVar23 == 0) {
          pLVar22 = DefaultLogger::get();
          Logger::warn(pLVar22,"Submaterial index is out of range");
          lVar45 = (long)local_80.
                         super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_80.
                         super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          __position_00._M_current = (uint *)puVar25[lVar45 * -0x590b21642c8590b + -1];
          if (__position_00._M_current == (uint *)puVar25[lVar45 * -0x590b21642c8590b]) {
            lVar45 = lVar45 * -0x590b21642c8590b + -3;
            goto LAB_004092cb;
          }
          lVar45 = lVar45 * -0x590b21642c8590b + -2;
          *__position_00._M_current = (uint)local_a8;
LAB_004092b1:
          puVar27[lVar45] = puVar27[lVar45] + 4;
        }
        else {
          __position_00._M_current = (uint *)puVar25[uVar23 * 3 + 2];
          if (__position_00._M_current != (uint *)puVar25[uVar23 * 3 + 3]) {
            lVar45 = uVar23 * 3 + 1;
            *__position_00._M_current = (uint)uVar21;
            goto LAB_004092b1;
          }
          lVar45 = uVar23 * 3;
LAB_004092cb:
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)(puVar27 + lVar45),
                     __position_00,(uint *)&local_a8);
        }
        uVar21 = (ulong)((uint)local_a8 + 1);
        local_a8 = (aiMesh *)CONCAT44(local_a8._4_4_,(uint)local_a8 + 1);
        pFVar37 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                  super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar23 = ((long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                        super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pFVar37 >> 2) *
                 0xf83e0f83e0f83e1;
      } while (uVar21 <= uVar23 && uVar23 - uVar21 != 0);
    }
    if (local_80.super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_80.super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      local_68 = mesh->amTexCoords;
      local_60 = 0;
      local_58 = puVar27;
      do {
        uVar21 = local_60;
        if (puVar27[local_60 * 3] != puVar27[local_60 * 3 + 1]) {
          paVar26 = (aiMesh *)operator_new(0x520);
          paVar26->mPrimitiveTypes = 0;
          paVar26->mNumVertices = 0;
          paVar26->mNumFaces = 0;
          memset(&paVar26->mVertices,0,0xcc);
          paVar26->mBones = (aiBone **)0x0;
          paVar26->mMaterialIndex = 0;
          (paVar26->mName).length = 0;
          (paVar26->mName).data[0] = '\0';
          memset((paVar26->mName).data + 1,0x1b,0x3ff);
          paVar26->mNumAnimMeshes = 0;
          paVar26->mAnimMeshes = (aiAnimMesh **)0x0;
          paVar26->mMethod = 0;
          (paVar26->mAABB).mMin.x = 0.0;
          (paVar26->mAABB).mMin.y = 0.0;
          (paVar26->mAABB).mMin.z = 0.0;
          (paVar26->mAABB).mMax.x = 0.0;
          (paVar26->mAABB).mMax.y = 0.0;
          (paVar26->mAABB).mMax.z = 0.0;
          paVar26->mTextureCoords[0] = (aiVector3D *)0x0;
          paVar26->mTextureCoords[1] = (aiVector3D *)0x0;
          paVar26->mTextureCoords[2] = (aiVector3D *)0x0;
          paVar26->mTextureCoords[3] = (aiVector3D *)0x0;
          paVar26->mTextureCoords[4] = (aiVector3D *)0x0;
          paVar26->mTextureCoords[5] = (aiVector3D *)0x0;
          paVar26->mTextureCoords[6] = (aiVector3D *)0x0;
          paVar26->mTextureCoords[7] = (aiVector3D *)0x0;
          paVar26->mNumUVComponents[0] = 0;
          paVar26->mNumUVComponents[1] = 0;
          paVar26->mNumUVComponents[2] = 0;
          paVar26->mNumUVComponents[3] = 0;
          paVar26->mNumUVComponents[4] = 0;
          paVar26->mNumUVComponents[5] = 0;
          paVar26->mNumUVComponents[6] = 0;
          paVar26->mNumUVComponents[7] = 0;
          paVar26->mColors[0] = (aiColor4D *)0x0;
          paVar26->mColors[1] = (aiColor4D *)0x0;
          paVar26->mColors[2] = (aiColor4D *)0x0;
          paVar26->mColors[3] = (aiColor4D *)0x0;
          paVar26->mColors[4] = (aiColor4D *)0x0;
          paVar26->mColors[5] = (aiColor4D *)0x0;
          paVar26->mColors[6] = (aiColor4D *)0x0;
          paVar26->mColors[7] = (aiColor4D *)0x0;
          paVar26->mPrimitiveTypes = 4;
          paVar26->mMaterialIndex = (uint)local_60;
          *(undefined1 *)
           (*(long *)&(local_48->mParser->m_vMaterials).
                      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                      ._M_impl.super__Vector_impl_data._M_start[mesh->iMaterialIndex].avSubMaterials
                      .
                      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                      ._M_impl + 0x2d8 + uVar21 * 0x2e0) = 1;
          paVar26->mColors[3] = (aiColor4D *)(ulong)mesh->iMaterialIndex;
          paVar26->mColors[2] = (aiColor4D *)mesh;
          iVar3._M_current = *(aiMesh ***)(local_50 + 8);
          local_a8 = paVar26;
          if (iVar3._M_current == *(aiMesh ***)(local_50 + 0x10)) {
            std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                      (local_50,iVar3,(aiMesh **)&local_a8);
          }
          else {
            *iVar3._M_current = paVar26;
            *(long *)(local_50 + 8) = *(long *)(local_50 + 8) + 8;
          }
          paVar26 = local_a8;
          local_98 = (pointer)(puVar27 + uVar21 * 3);
          local_a8->mNumVertices =
               (int)((ulong)((long)(local_98->super_Material).mName._M_dataplus._M_p -
                            (long)(local_98->super_Material)._vptr_Material) >> 2) * 3;
          local_a8->mNumFaces =
               (uint)((ulong)((long)(local_98->super_Material).mName._M_dataplus._M_p -
                             (long)(local_98->super_Material)._vptr_Material) >> 2);
          pBVar4 = (mesh->mBones).
                   super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl
                   .super__Vector_impl_data._M_start;
          pBVar5 = (mesh->mBones).
                   super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl
                   .super__Vector_impl_data._M_finish;
          if (pBVar4 == pBVar5) {
            local_a0 = (aiMesh *)0x0;
          }
          else {
            uVar24 = (long)pBVar5 - (long)pBVar4 >> 5;
            auVar11._8_8_ = 0;
            auVar11._0_8_ = uVar24;
            uVar21 = SUB168(auVar11 * ZEXT816(0x18),0);
            uVar23 = uVar21 + 8;
            if (0xfffffffffffffff7 < uVar21) {
              uVar23 = 0xffffffffffffffff;
            }
            if (SUB168(auVar11 * ZEXT816(0x18),8) != 0) {
              uVar23 = 0xffffffffffffffff;
            }
            puVar27 = (ulong *)operator_new__(uVar23);
            *puVar27 = uVar24;
            local_a0 = (aiMesh *)(puVar27 + 1);
            if (pBVar5 != pBVar4) {
              memset(local_a0,0,((uVar24 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
            }
          }
          uVar21 = (ulong)paVar26->mNumFaces;
          puVar27 = (ulong *)operator_new__(uVar21 * 0x10 + 8);
          *puVar27 = uVar21;
          paVar28 = (aiFace *)(puVar27 + 1);
          if (uVar21 != 0) {
            paVar38 = paVar28;
            do {
              paVar38->mNumIndices = 0;
              paVar38->mIndices = (uint *)0x0;
              paVar38 = paVar38 + 1;
            } while (paVar38 != paVar28 + uVar21);
          }
          paVar26->mFaces = paVar28;
          uVar20 = paVar26->mNumVertices;
          if (uVar20 != 0) {
            paVar29 = (aiVector3D *)operator_new__((ulong)uVar20 * 0xc);
            memset(paVar29,0,(((ulong)uVar20 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
            paVar26->mVertices = paVar29;
            uVar21 = (ulong)paVar26->mNumVertices;
            paVar29 = (aiVector3D *)operator_new__(uVar21 * 0xc);
            if (uVar21 != 0) {
              memset(paVar29,0,((uVar21 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
            }
            paVar26->mNormals = paVar29;
            pp_Var30 = (local_98->super_Material)._vptr_Material;
            if ((_func_int **)(local_98->super_Material).mName._M_dataplus._M_p != pp_Var30) {
              uVar21 = 0;
              uVar23 = 0;
              do {
                local_88 = (aiBone **)(ulong)*(uint *)((long)pp_Var30 + uVar21 * 4);
                local_38 = uVar21;
                puVar31 = (uint *)operator_new__(0xc);
                local_a8->mFaces[uVar21].mIndices = puVar31;
                local_a8->mFaces[uVar21].mNumIndices = 3;
                lVar45 = 0;
                do {
                  uVar24 = (ulong)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                                  super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                                  ._M_impl.super__Vector_impl_data._M_start[(long)local_88].
                                  super_FaceWithSmoothingGroup.mIndices[lVar45];
                  paVar6 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  paVar29 = local_a8->mVertices;
                  uVar20 = (uint)uVar23;
                  paVar29[uVar23].z = *(float *)((long)(paVar6 + uVar24) + 8);
                  paVar6 = paVar6 + uVar24;
                  fVar16 = paVar6->y;
                  paVar29 = paVar29 + uVar23;
                  paVar29->x = paVar6->x;
                  paVar29->y = fVar16;
                  paVar6 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  paVar29 = local_a8->mNormals;
                  paVar29[uVar23].z = paVar6[uVar24].z;
                  paVar6 = paVar6 + uVar24;
                  fVar16 = paVar6->y;
                  paVar29 = paVar29 + uVar23;
                  paVar29->x = paVar6->x;
                  paVar29->y = fVar16;
                  if ((mesh->mBones).
                      super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                      _M_impl.super__Vector_impl_data._M_start !=
                      (mesh->mBones).
                      super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    if (local_a0 == (aiMesh *)0x0) {
                      __assert_fail("avOutputBones",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/ASE/ASELoader.cpp"
                                    ,0x400,
                                    "void Assimp::ASEImporter::ConvertMeshes(ASE::Mesh &, std::vector<aiMesh *> &)"
                                   );
                    }
                    pBVar46 = (mesh->mBoneVertices).
                              super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    uVar23 = ((long)(mesh->mBoneVertices).
                                    super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar46 >> 3)
                             * -0x5555555555555555;
                    if ((uVar24 <= uVar23 && uVar23 - uVar24 != 0) &&
                       (ppVar44 = *(pointer *)
                                   &pBVar46[uVar24].mBoneWeights.
                                    super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                    ._M_impl,
                       ppVar44 !=
                       *(pointer *)
                        ((long)&(mesh->mBoneVertices).
                                super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar24].mBoneWeights.
                                super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                ._M_impl + 8))) {
                      do {
                        local_90.second = ppVar44->second;
                        local_90.first = uVar20;
                        std::
                        vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                        ::emplace_back<std::pair<unsigned_int,float>>
                                  ((vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                                    *)((long)local_a0 + (long)ppVar44->first * 3 * 8),&local_90);
                        ppVar44 = ppVar44 + 1;
                      } while (ppVar44 !=
                               *(pointer *)
                                ((long)&(mesh->mBoneVertices).
                                        super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar24].
                                        mBoneWeights.
                                        super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                        ._M_impl + 8));
                    }
                  }
                  local_a8->mFaces[uVar21].mIndices[lVar45] = uVar20;
                  lVar45 = lVar45 + 1;
                  uVar23 = (ulong)(uVar20 + 1);
                } while (lVar45 != 3);
                uVar21 = (ulong)((int)local_38 + 1);
                pp_Var30 = (local_98->super_Material)._vptr_Material;
              } while (uVar21 < (ulong)((long)(local_98->super_Material).mName._M_dataplus._M_p -
                                        (long)pp_Var30 >> 2));
            }
          }
          lVar45 = 0;
          puVar27 = local_58;
          do {
            paVar26 = local_a8;
            if (local_68[lVar45].
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_68[lVar45].
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              uVar21 = (ulong)local_a8->mNumVertices;
              paVar29 = (aiVector3D *)operator_new__(uVar21 * 0xc);
              if (uVar21 != 0) {
                memset(paVar29,0,((uVar21 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
              }
              paVar26->mTextureCoords[lVar45] = paVar29;
              pp_Var30 = (local_98->super_Material)._vptr_Material;
              if ((_func_int **)(local_98->super_Material).mName._M_dataplus._M_p != pp_Var30) {
                uVar21 = 0;
                iVar39 = 0;
                do {
                  uVar20 = *(uint *)((long)pp_Var30 + uVar21 * 4);
                  lVar40 = 0;
                  do {
                    uVar42 = iVar39 + (int)lVar40;
                    uVar1 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                            super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar20].
                            super_FaceWithSmoothingGroup.mIndices[lVar40];
                    paVar6 = local_68[lVar45].
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    paVar29 = local_a8->mTextureCoords[lVar45];
                    paVar29[uVar42].z = paVar6[uVar1].z;
                    paVar6 = paVar6 + uVar1;
                    fVar16 = paVar6->y;
                    paVar29 = paVar29 + uVar42;
                    paVar29->x = paVar6->x;
                    paVar29->y = fVar16;
                    lVar40 = lVar40 + 1;
                  } while (lVar40 != 3);
                  uVar21 = (ulong)((int)uVar21 + 1);
                  pp_Var30 = (local_98->super_Material)._vptr_Material;
                  iVar39 = iVar39 + 3;
                } while (uVar21 < (ulong)((long)(local_98->super_Material).mName._M_dataplus._M_p -
                                          (long)pp_Var30 >> 2));
              }
              local_a8->mNumUVComponents[lVar45] = mesh->mNumUVComponents[lVar45];
              puVar27 = local_58;
            }
            paVar26 = local_a8;
            lVar45 = lVar45 + 1;
          } while (lVar45 != 8);
          if ((mesh->mVertexColors).
              super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (mesh->mVertexColors).
              super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            uVar20 = local_a8->mNumVertices;
            uVar21 = (ulong)uVar20 << 4;
            paVar32 = (aiColor4D *)operator_new__(uVar21);
            if ((ulong)uVar20 != 0) {
              memset(paVar32,0,uVar21);
            }
            paVar26->mColors[0] = paVar32;
            pp_Var30 = (local_98->super_Material)._vptr_Material;
            if ((_func_int **)(local_98->super_Material).mName._M_dataplus._M_p != pp_Var30) {
              uVar21 = 0;
              iVar39 = 0;
              do {
                uVar20 = *(uint *)((long)pp_Var30 + uVar21 * 4);
                lVar45 = 0;
                do {
                  paVar8 = (mesh->mVertexColors).
                           super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                           _M_impl.super__Vector_impl_data._M_start +
                           (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                           super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar20].
                           super_FaceWithSmoothingGroup.mIndices[lVar45];
                  fVar16 = paVar8->g;
                  fVar17 = paVar8->b;
                  fVar18 = paVar8->a;
                  paVar32 = paVar26->mColors[0] + (uint)(iVar39 + (int)lVar45);
                  paVar32->r = paVar8->r;
                  paVar32->g = fVar16;
                  paVar32->b = fVar17;
                  paVar32->a = fVar18;
                  lVar45 = lVar45 + 1;
                } while (lVar45 != 3);
                uVar21 = (ulong)((int)uVar21 + 1);
                pp_Var30 = (local_98->super_Material)._vptr_Material;
                iVar39 = iVar39 + 3;
              } while (uVar21 < (ulong)((long)(local_98->super_Material).mName._M_dataplus._M_p -
                                        (long)pp_Var30 >> 2));
            }
          }
          paVar26 = local_a8;
          if ((mesh->mBones).
              super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (mesh->mBones).
              super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_a8->mNumBones = 0;
            if ((mesh->mBones).
                super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (mesh->mBones).
                super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
                super__Vector_impl_data._M_start) {
              uVar20 = 1;
              uVar21 = 0;
              do {
                if (*(ulong *)((long)local_a0 + uVar21 * 3 * 8) !=
                    *(ulong *)((long)local_a0 + (uVar21 * 3 + 1) * 8)) {
                  local_a8->mNumBones = local_a8->mNumBones + 1;
                }
                uVar21 = (ulong)uVar20;
                uVar20 = uVar20 + 1;
              } while (uVar21 < (ulong)((long)(mesh->mBones).
                                              super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(mesh->mBones).
                                              super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 5));
            }
            ppaVar33 = (aiBone **)operator_new__((ulong)local_a8->mNumBones << 3);
            paVar26->mBones = ppaVar33;
            paVar26 = local_a0;
            if ((mesh->mBones).
                super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (mesh->mBones).
                super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
                super__Vector_impl_data._M_start) {
              pMVar41 = (pointer)0x0;
              do {
                if (*(ulong *)((long)paVar26 + (long)pMVar41 * 3 * 8) !=
                    *(ulong *)((long)paVar26 + ((long)pMVar41 * 3 + 1) * 8)) {
                  local_98 = pMVar41;
                  local_88 = ppaVar33;
                  paVar34 = (aiBone *)operator_new(0x460);
                  (paVar34->mName).length = 0;
                  (paVar34->mName).data[0] = '\0';
                  memset((paVar34->mName).data + 1,0x1b,0x3ff);
                  paVar34->mNumWeights = 0;
                  paVar34->mWeights = (aiVertexWeight *)0x0;
                  (paVar34->mOffsetMatrix).a1 = 1.0;
                  (paVar34->mOffsetMatrix).a2 = 0.0;
                  (paVar34->mOffsetMatrix).a3 = 0.0;
                  (paVar34->mOffsetMatrix).a4 = 0.0;
                  (paVar34->mOffsetMatrix).b1 = 0.0;
                  (paVar34->mOffsetMatrix).b2 = 1.0;
                  (paVar34->mOffsetMatrix).b3 = 0.0;
                  (paVar34->mOffsetMatrix).b4 = 0.0;
                  (paVar34->mOffsetMatrix).c1 = 0.0;
                  (paVar34->mOffsetMatrix).c2 = 0.0;
                  (paVar34->mOffsetMatrix).c3 = 1.0;
                  (paVar34->mOffsetMatrix).c4 = 0.0;
                  (paVar34->mOffsetMatrix).d1 = 0.0;
                  (paVar34->mOffsetMatrix).d2 = 0.0;
                  (paVar34->mOffsetMatrix).d3 = 0.0;
                  (paVar34->mOffsetMatrix).d4 = 1.0;
                  *local_88 = paVar34;
                  pBVar4 = (mesh->mBones).
                           super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  uVar21 = pBVar4[(long)pMVar41].mName._M_string_length;
                  if (uVar21 < 0x400) {
                    (paVar34->mName).length = (ai_uint32)uVar21;
                    memcpy((paVar34->mName).data,pBVar4[(long)pMVar41].mName._M_dataplus._M_p,uVar21
                          );
                    (paVar34->mName).data[uVar21] = '\0';
                  }
                  puVar27 = (ulong *)((long)local_a0 + (long)pMVar41 * 3 * 8);
                  uVar23 = (long)(puVar27[1] - *puVar27) >> 3;
                  paVar34->mNumWeights = (uint)uVar23;
                  uVar23 = uVar23 & 0xffffffff;
                  uVar21 = uVar23 * 8;
                  paVar35 = (aiVertexWeight *)operator_new__(uVar21);
                  if (uVar23 != 0) {
                    memset(paVar35,0,uVar21);
                  }
                  paVar34->mWeights = paVar35;
                  if (paVar34->mNumWeights != 0) {
                    uVar21 = 0;
                    do {
                      uVar23 = *puVar27;
                      paVar34->mWeights[uVar21].mVertexId = *(uint *)(uVar23 + uVar21 * 8);
                      paVar34->mWeights[uVar21].mWeight = *(float *)(uVar23 + 4 + uVar21 * 8);
                      uVar21 = uVar21 + 1;
                    } while (uVar21 < paVar34->mNumWeights);
                  }
                  ppaVar33 = local_88 + 1;
                  pMVar41 = local_98;
                  paVar26 = local_a0;
                }
                pMVar41 = (pointer)(ulong)((int)pMVar41 + 1);
              } while (pMVar41 < (pointer)((long)(mesh->mBones).
                                                 super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(mesh->mBones).
                                                 super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                                 ._M_impl.super__Vector_impl_data._M_start >> 5));
            }
            puVar27 = local_58;
            if (paVar26 != (aiMesh *)0x0) {
              uVar21 = *(ulong *)((long)paVar26 + -8);
              if (uVar21 != 0) {
                lVar45 = uVar21 * 0x18;
                do {
                  pvVar36 = *(void **)((long)paVar26 + lVar45 + -0x18);
                  if (pvVar36 != (void *)0x0) {
                    operator_delete(pvVar36,*(long *)((long)paVar26 + -8 + lVar45) - (long)pvVar36);
                  }
                  lVar45 = lVar45 + -0x18;
                } while (lVar45 != 0);
              }
              operator_delete__((ulong *)((long)paVar26 + -8),uVar21 * 0x18 + 8);
            }
          }
        }
        local_60 = (ulong)((int)local_60 + 1);
        uVar21 = ((long)local_80.
                        super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_80.
                        super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x2c8590b21642c859;
      } while (local_60 <= uVar21 && uVar21 - local_60 != 0);
    }
    puVar27 = local_40;
    uVar21 = *local_40 * 0x18;
    uVar23 = uVar21;
    uVar24 = *local_40;
    while (uVar24 != 0) {
      pvVar36 = *(void **)((long)puVar27 + (uVar23 - 0x10));
      if (pvVar36 != (void *)0x0) {
        operator_delete(pvVar36,*(long *)((long)puVar27 + uVar23) - (long)pvVar36);
      }
      uVar23 = uVar23 - 0x18;
      uVar24 = uVar23;
    }
    operator_delete__(puVar27,uVar21 + 8);
    std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::~vector(&local_80);
  }
  return;
}

Assistant:

void ASEImporter::ConvertMeshes(ASE::Mesh& mesh, std::vector<aiMesh*>& avOutMeshes)
{
    // validate the material index of the mesh
    if (mesh.iMaterialIndex >= mParser->m_vMaterials.size())    {
        mesh.iMaterialIndex = (unsigned int)mParser->m_vMaterials.size()-1;
        ASSIMP_LOG_WARN("Material index is out of range");
    }

    // If the material the mesh is assigned to is consisting of submeshes, split it
    if (!mParser->m_vMaterials[mesh.iMaterialIndex].avSubMaterials.empty()) {
        std::vector<ASE::Material> vSubMaterials = mParser->
            m_vMaterials[mesh.iMaterialIndex].avSubMaterials;

        std::vector<unsigned int>* aiSplit = new std::vector<unsigned int>[vSubMaterials.size()];

        // build a list of all faces per sub-material
        for (unsigned int i = 0; i < mesh.mFaces.size();++i)    {
            // check range
            if (mesh.mFaces[i].iMaterial >= vSubMaterials.size()) {
                ASSIMP_LOG_WARN("Submaterial index is out of range");

                // use the last material instead
                aiSplit[vSubMaterials.size()-1].push_back(i);
            }
            else aiSplit[mesh.mFaces[i].iMaterial].push_back(i);
        }

        // now generate submeshes
        for (unsigned int p = 0; p < vSubMaterials.size();++p)  {
            if (!aiSplit[p].empty())    {

                aiMesh* p_pcOut = new aiMesh();
                p_pcOut->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

                // let the sub material index
                p_pcOut->mMaterialIndex = p;

                // we will need this material
                mParser->m_vMaterials[mesh.iMaterialIndex].avSubMaterials[p].bNeed = true;

                // store the real index here ... color channel 3
                p_pcOut->mColors[3] = (aiColor4D*)(uintptr_t)mesh.iMaterialIndex;

                // store a pointer to the mesh in color channel 2
                p_pcOut->mColors[2] = (aiColor4D*) &mesh;
                avOutMeshes.push_back(p_pcOut);

                // convert vertices
                p_pcOut->mNumVertices = (unsigned int)aiSplit[p].size()*3;
                p_pcOut->mNumFaces = (unsigned int)aiSplit[p].size();

                // receive output vertex weights
                std::vector<std::pair<unsigned int, float> > *avOutputBones = NULL;
                if (!mesh.mBones.empty())   {
                    avOutputBones = new std::vector<std::pair<unsigned int, float> >[mesh.mBones.size()];
                }

                // allocate enough storage for faces
                p_pcOut->mFaces = new aiFace[p_pcOut->mNumFaces];

                unsigned int iBase = 0,iIndex;
                if (p_pcOut->mNumVertices)  {
                    p_pcOut->mVertices = new aiVector3D[p_pcOut->mNumVertices];
                    p_pcOut->mNormals  = new aiVector3D[p_pcOut->mNumVertices];
                    for (unsigned int q = 0; q < aiSplit[p].size();++q) {

                        iIndex = aiSplit[p][q];

                        p_pcOut->mFaces[q].mIndices = new unsigned int[3];
                        p_pcOut->mFaces[q].mNumIndices = 3;

                        for (unsigned int t = 0; t < 3;++t, ++iBase)    {
                            const uint32_t iIndex2 = mesh.mFaces[iIndex].mIndices[t];

                            p_pcOut->mVertices[iBase] = mesh.mPositions [iIndex2];
                            p_pcOut->mNormals [iBase] = mesh.mNormals   [iIndex2];

                            // convert bones, if existing
                            if (!mesh.mBones.empty()) {
                                ai_assert(avOutputBones);
                                // check whether there is a vertex weight for this vertex index
                                if (iIndex2 < mesh.mBoneVertices.size())    {

                                    for (std::vector<std::pair<int,float> >::const_iterator
                                        blubb =  mesh.mBoneVertices[iIndex2].mBoneWeights.begin();
                                        blubb != mesh.mBoneVertices[iIndex2].mBoneWeights.end();++blubb)    {

                                        // NOTE: illegal cases have already been filtered out
                                        avOutputBones[(*blubb).first].push_back(std::pair<unsigned int, float>(
                                            iBase,(*blubb).second));
                                    }
                                }
                            }
                            p_pcOut->mFaces[q].mIndices[t] = iBase;
                        }
                    }
                }
                // convert texture coordinates (up to AI_MAX_NUMBER_OF_TEXTURECOORDS sets supported)
                for (unsigned int c = 0; c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c) {
                    if (!mesh.amTexCoords[c].empty())
                    {
                        p_pcOut->mTextureCoords[c] = new aiVector3D[p_pcOut->mNumVertices];
                        iBase = 0;
                        for (unsigned int q = 0; q < aiSplit[p].size();++q) {
                            iIndex = aiSplit[p][q];
                            for (unsigned int t = 0; t < 3;++t) {
                                p_pcOut->mTextureCoords[c][iBase++] = mesh.amTexCoords[c][mesh.mFaces[iIndex].mIndices[t]];
                            }
                        }
                        // Setup the number of valid vertex components
                        p_pcOut->mNumUVComponents[c] = mesh.mNumUVComponents[c];
                    }
                }

                // Convert vertex colors (only one set supported)
                if (!mesh.mVertexColors.empty()){
                    p_pcOut->mColors[0] = new aiColor4D[p_pcOut->mNumVertices];
                    iBase = 0;
                    for (unsigned int q = 0; q < aiSplit[p].size();++q) {
                        iIndex = aiSplit[p][q];
                        for (unsigned int t = 0; t < 3;++t) {
                            p_pcOut->mColors[0][iBase++] = mesh.mVertexColors[mesh.mFaces[iIndex].mIndices[t]];
                        }
                    }
                }
                // Copy bones
                if (!mesh.mBones.empty())   {
                    p_pcOut->mNumBones = 0;
                    for (unsigned int mrspock = 0; mrspock < mesh.mBones.size();++mrspock)
                        if (!avOutputBones[mrspock].empty())p_pcOut->mNumBones++;

                    p_pcOut->mBones = new aiBone* [ p_pcOut->mNumBones ];
                    aiBone** pcBone = p_pcOut->mBones;
                    for (unsigned int mrspock = 0; mrspock < mesh.mBones.size();++mrspock)
                    {
                        if (!avOutputBones[mrspock].empty())    {
                            // we will need this bone. add it to the output mesh and
                            // add all per-vertex weights
                            aiBone* pc = *pcBone = new aiBone();
                            pc->mName.Set(mesh.mBones[mrspock].mName);

                            pc->mNumWeights = (unsigned int)avOutputBones[mrspock].size();
                            pc->mWeights = new aiVertexWeight[pc->mNumWeights];

                            for (unsigned int captainkirk = 0; captainkirk < pc->mNumWeights;++captainkirk)
                            {
                                const std::pair<unsigned int,float>& ref = avOutputBones[mrspock][captainkirk];
                                pc->mWeights[captainkirk].mVertexId = ref.first;
                                pc->mWeights[captainkirk].mWeight = ref.second;
                            }
                            ++pcBone;
                        }
                    }
                    // delete allocated storage
                    delete[] avOutputBones;
                }
            }
        }
        // delete storage
        delete[] aiSplit;
    }
    else
    {
        // Otherwise we can simply copy the data to one output mesh
        // This codepath needs less memory and uses fast memcpy()s
        // to do the actual copying. So I think it is worth the
        // effort here.

        aiMesh* p_pcOut = new aiMesh();
        p_pcOut->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

        // set an empty sub material index
        p_pcOut->mMaterialIndex = ASE::Face::DEFAULT_MATINDEX;
        mParser->m_vMaterials[mesh.iMaterialIndex].bNeed = true;

        // store the real index here ... in color channel 3
        p_pcOut->mColors[3] = (aiColor4D*)(uintptr_t)mesh.iMaterialIndex;

        // store a pointer to the mesh in color channel 2
        p_pcOut->mColors[2] = (aiColor4D*) &mesh;
        avOutMeshes.push_back(p_pcOut);

        // If the mesh hasn't faces or vertices, there are two cases
        // possible: 1. the model is invalid. 2. This is a dummy
        // helper object which we are going to remove later ...
        if (mesh.mFaces.empty() || mesh.mPositions.empty()) {
            return;
        }

        // convert vertices
        p_pcOut->mNumVertices = (unsigned int)mesh.mPositions.size();
        p_pcOut->mNumFaces = (unsigned int)mesh.mFaces.size();

        // allocate enough storage for faces
        p_pcOut->mFaces = new aiFace[p_pcOut->mNumFaces];

        // copy vertices
        p_pcOut->mVertices = new aiVector3D[mesh.mPositions.size()];
        memcpy(p_pcOut->mVertices,&mesh.mPositions[0],
            mesh.mPositions.size() * sizeof(aiVector3D));

        // copy normals
        p_pcOut->mNormals = new aiVector3D[mesh.mNormals.size()];
        memcpy(p_pcOut->mNormals,&mesh.mNormals[0],
            mesh.mNormals.size() * sizeof(aiVector3D));

        // copy texture coordinates
        for (unsigned int c = 0; c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c)    {
            if (!mesh.amTexCoords[c].empty())   {
                p_pcOut->mTextureCoords[c] = new aiVector3D[mesh.amTexCoords[c].size()];
                memcpy(p_pcOut->mTextureCoords[c],&mesh.amTexCoords[c][0],
                    mesh.amTexCoords[c].size() * sizeof(aiVector3D));

                // setup the number of valid vertex components
                p_pcOut->mNumUVComponents[c] = mesh.mNumUVComponents[c];
            }
        }

        // copy vertex colors
        if (!mesh.mVertexColors.empty())    {
            p_pcOut->mColors[0] = new aiColor4D[mesh.mVertexColors.size()];
            memcpy(p_pcOut->mColors[0],&mesh.mVertexColors[0],
                mesh.mVertexColors.size() * sizeof(aiColor4D));
        }

        // copy faces
        for (unsigned int iFace = 0; iFace < p_pcOut->mNumFaces;++iFace)    {
            p_pcOut->mFaces[iFace].mNumIndices = 3;
            p_pcOut->mFaces[iFace].mIndices = new unsigned int[3];

            // copy indices
            p_pcOut->mFaces[iFace].mIndices[0] = mesh.mFaces[iFace].mIndices[0];
            p_pcOut->mFaces[iFace].mIndices[1] = mesh.mFaces[iFace].mIndices[1];
            p_pcOut->mFaces[iFace].mIndices[2] = mesh.mFaces[iFace].mIndices[2];
        }

        // copy vertex bones
        if (!mesh.mBones.empty() && !mesh.mBoneVertices.empty())    {
            std::vector<std::vector<aiVertexWeight> > avBonesOut( mesh.mBones.size() );

            // find all vertex weights for this bone
            unsigned int quak = 0;
            for (std::vector<BoneVertex>::const_iterator harrypotter =  mesh.mBoneVertices.begin();
                harrypotter != mesh.mBoneVertices.end();++harrypotter,++quak)   {

                for (std::vector<std::pair<int,float> >::const_iterator
                    ronaldweasley  = (*harrypotter).mBoneWeights.begin();
                    ronaldweasley != (*harrypotter).mBoneWeights.end();++ronaldweasley)
                {
                    aiVertexWeight weight;
                    weight.mVertexId = quak;
                    weight.mWeight = (*ronaldweasley).second;
                    avBonesOut[(*ronaldweasley).first].push_back(weight);
                }
            }

            // now build a final bone list
            p_pcOut->mNumBones = 0;
            for (unsigned int jfkennedy = 0; jfkennedy < mesh.mBones.size();++jfkennedy)
                if (!avBonesOut[jfkennedy].empty())p_pcOut->mNumBones++;

            p_pcOut->mBones = new aiBone*[p_pcOut->mNumBones];
            aiBone** pcBone = p_pcOut->mBones;
            for (unsigned int jfkennedy = 0; jfkennedy < mesh.mBones.size();++jfkennedy)    {
                if (!avBonesOut[jfkennedy].empty()) {
                    aiBone* pc = *pcBone = new aiBone();
                    pc->mName.Set(mesh.mBones[jfkennedy].mName);
                    pc->mNumWeights = (unsigned int)avBonesOut[jfkennedy].size();
                    pc->mWeights = new aiVertexWeight[pc->mNumWeights];
                    ::memcpy(pc->mWeights,&avBonesOut[jfkennedy][0],
                        sizeof(aiVertexWeight) * pc->mNumWeights);
                    ++pcBone;
                }
            }
        }
    }
}